

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open.c
# Opt level: O1

FILE * open_file_std(char *fname,char *mode)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  undefined8 *puVar4;
  FILE *pFVar5;
  char *pcVar6;
  FILE *extraout_RAX;
  long lVar7;
  uint n;
  long lVar8;
  
  n = 0x1290b4;
  iVar2 = strcmp(fname,"-");
  if (iVar2 != 0) {
    pFVar3 = fopen(fname,mode);
    return (FILE *)pFVar3;
  }
  if (*mode == 'w') {
    puVar4 = (undefined8 *)&stdout;
  }
  else {
    if (*mode != 'r') {
      open_file_std_cold_1();
      iVar2 = (int)mode;
      if ((0 < iVar2) && (0 < (int)n)) {
        pFVar5 = (FILE *)chk_alloc(1,0x20);
        pFVar5->_flags = iVar2;
        *(uint *)&pFVar5->field_0x4 = n;
        *(uint *)&pFVar5->_IO_read_ptr = iVar2 + 0x1fU >> 5;
        pcVar6 = (char *)chk_alloc(n,8);
        pFVar5->_IO_read_end = pcVar6;
        pcVar6 = (char *)chk_alloc(*(int *)&pFVar5->field_0x4 * *(int *)&pFVar5->_IO_read_ptr,4);
        pFVar5->_IO_read_base = pcVar6;
        iVar2 = *(int *)&pFVar5->field_0x4;
        if (0 < (long)iVar2) {
          iVar1 = *(int *)&pFVar5->_IO_read_ptr;
          lVar7 = 0;
          lVar8 = 0;
          do {
            *(char **)(pFVar5->_IO_read_end + lVar8 * 8) = pFVar5->_IO_read_base + lVar7;
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + (long)iVar1 * 4;
          } while (iVar2 != lVar8);
        }
        return pFVar5;
      }
      mod2dense_allocate_cold_1();
      free(*(void **)(mode + 0x18));
      free(*(void **)(mode + 0x10));
      free(mode);
      return extraout_RAX;
    }
    puVar4 = (undefined8 *)&stdin;
  }
  return (FILE *)*puVar4;
}

Assistant:

FILE *open_file_std
( char *fname,	/* Name of file to open, or "-" for stdin/stdout */
  char *mode	/* Mode for opening: eg, "r" or "w" */
)
{ 
  if (strcmp(fname,"-")==0)
  { switch (mode[0])
    { case 'r': 
      { return stdin;
      }
      case 'w': 
      { return stdout;
      }
      default:  
      { fprintf(stderr,"Bad mode passed to open_file_std: %s\n",mode);
        exit(1);
      }
    }
  }
  else
  { return fopen(fname,mode);
  }
}